

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O1

uint64_t __thiscall leveldb::anon_unknown_2::FileState::Size(FileState *this)

{
  long lVar1;
  uint64_t uVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->blocks_mutex_);
  if (iVar3 == 0) {
    uVar2 = this->size_;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->blocks_mutex_);
      return uVar2;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__throw_system_error(iVar3);
  }
  __stack_chk_fail();
}

Assistant:

uint64_t Size() const {
    MutexLock lock(&blocks_mutex_);
    return size_;
  }